

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::address_to_bytes_abi_cxx11_(string *__return_storage_ptr__,aux *this,address *a)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  address *a_local;
  string *ret;
  
  out.container._7_1_ = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::back_insert_iterator(&local_28,__return_storage_ptr__);
  write_address<std::back_insert_iterator<std::__cxx11::string>&>((address *)this,&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string address_to_bytes(address const& a)
	{
		std::string ret;
		std::back_insert_iterator<std::string> out(ret);
		aux::write_address(a, out);
		return ret;
	}